

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O3

int ohitmon(monst *magr,monst *mtmp,obj *otmp,obj *ostack,int range,boolean verbose)

{
  int *piVar1;
  permonst *ppVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  obj *poVar10;
  uchar uVar11;
  byte bVar12;
  ulong uVar13;
  
  uVar11 = mtmp->m_ap_type;
  bVar12 = viz_array[bhitpos.y][bhitpos.x] & 2;
  iVar4 = find_mac(mtmp);
  iVar5 = omon_adj(mtmp,otmp,'\0');
  uVar6 = mt_random();
  if (iVar4 + iVar5 + 5 <= (int)(uVar6 % 0x14)) {
    if ((uVar11 == '\x03') || (uVar11 == '\0')) {
      if (bVar12 == 0) {
        if (verbose != '\0') {
          pline("It is missed.");
        }
      }
      else {
        pcVar8 = distant_name(otmp,mshot_xname);
        miss(pcVar8,mtmp);
      }
    }
    if (range == 0) {
      drop_throw(magr,otmp,ostack,'\0','\0',(int)mtmp->mx,(int)mtmp->my);
      return 1;
    }
    return 0;
  }
  if (otmp->oclass == '\b') {
    if ((uVar11 != '\0') && (uVar11 != '\x03')) {
      seemimic(mtmp);
    }
    mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
    if (bVar12 != 0) {
      otmp->field_0x4a = otmp->field_0x4a | 0x20;
    }
    potionhit(mtmp,otmp,'\0');
    return 1;
  }
  iVar4 = dmgval(magr,otmp,'\x01',mtmp);
  if ((otmp->otyp == 0x219) && ((mtmp->mintrinsics & 0x40) != 0)) {
    iVar4 = 0;
  }
  if ((uVar11 != '\0') && (uVar11 != '\x03')) {
    seemimic(mtmp);
  }
  mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
  if (bVar12 == 0) {
    if (verbose != '\0') {
      pcVar8 = Monnam(mtmp);
      pcVar9 = exclam(iVar4);
      pline("%s is hit%s",pcVar8,pcVar9);
    }
  }
  else {
    pcVar8 = distant_name(otmp,mshot_xname);
    pcVar9 = exclam(iVar4);
    hit(pcVar8,'\0',mtmp,pcVar9);
  }
  if ((((mtmp->data == mons + 0xdb) && ((mtmp->field_0x61 & 1) == 0)) && (6 < mtmp->mhp)) &&
     (((objects[otmp->otyp].oc_oprop != '\x04' && (bVar3 = obj_resists(otmp,5,0x32), bVar3 == '\0'))
      && (bVar3 = is_quest_artifact(otmp), bVar3 == '\0')))) {
    uVar13 = (ulong)otmp->owt / 100;
    if ((int)otmp->owt < 0x65) {
      uVar13 = 1;
    }
    uVar6 = mt_random();
    uVar7 = (uint)((ulong)uVar6 % uVar13);
    uVar6 = 5;
    if (uVar7 < 5) {
      uVar6 = uVar7;
    }
    mtmp->mhp = mtmp->mhp + ~uVar6;
    if (bVar12 != 0) {
      pline("It disintegrates!");
    }
    obfree(otmp,(obj *)0x0);
    return 1;
  }
  if ((((otmp->field_0x4b & 0x80) != 0) && (otmp->oclass == '\x02')) &&
     ((byte)(objects[otmp->otyp].oc_subtyp + 0x1aU) < 5)) {
    if ((mtmp->mintrinsics & 0x20) == 0) {
      uVar6 = mt_random();
      if ((uVar6 * -0x11111111 >> 1 | (uint)((uVar6 * -0x11111111 & 1) != 0) << 0x1f) < 0x8888889) {
        if (bVar12 != 0) {
          pline("The poison was deadly...");
        }
        iVar4 = mtmp->mhp;
      }
      else {
        uVar6 = mt_random();
        iVar4 = iVar4 + uVar6 % 6 + 1;
      }
    }
    else if (bVar12 != 0) {
      mon_nam(mtmp);
      pline("The poison doesn\'t seem to affect %s.");
    }
  }
  if (((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x1f0) == 0xe0) &&
     (bVar3 = hates_silver(mtmp->data), bVar3 != '\0')) {
    if (bVar12 == 0) {
      if (verbose != '\0') {
        pline("Its flesh is seared!");
      }
    }
    else {
      pcVar8 = mon_nam(mtmp);
      s_suffix(pcVar8);
      pline("The silver sears %s flesh!");
    }
  }
  if ((otmp->otyp == 0x219) && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) {
    if ((mtmp->mintrinsics & 0x40) == 0) {
      if (bVar12 == 0) {
        if (verbose != '\0') {
          pline("It is burned!");
        }
      }
      else {
        mon_nam(mtmp);
        pcVar8 = "The acid burns %s!";
LAB_001f4d0e:
        pline(pcVar8);
      }
    }
    else {
      if (bVar12 != 0 || verbose != '\0') {
        Monnam(mtmp);
        pcVar8 = "%s is unaffected.";
        iVar4 = 0;
        goto LAB_001f4d0e;
      }
      iVar4 = 0;
    }
  }
  piVar1 = &mtmp->mhp;
  iVar5 = *piVar1;
  *piVar1 = *piVar1 - iVar4;
  if (*piVar1 != 0 && SBORROW4(iVar5,iVar4) == *piVar1 < 0) goto LAB_001f50be;
  if (verbose != '\0' || bVar12 != 0) {
    pcVar8 = Monnam(mtmp);
    ppVar2 = mtmp->data;
    pcVar9 = "destroyed";
    if ((ppVar2->mlet != '7') &&
       ((ppVar2 != mons + 0x33 && ppVar2->mlet != '\x16') && (ppVar2->mflags2 & 2) == 0)) {
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001f4ea5;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f4df1;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f4de8;
        }
        else {
LAB_001f4de8:
          if (ublindf == (obj *)0x0) goto LAB_001f4efb;
LAB_001f4df1:
          if (ublindf->oartifact != '\x1d') goto LAB_001f4efb;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((ppVar2->mflags3 & 0x200) != 0))
        goto LAB_001f4ea5;
LAB_001f4efb:
        if (((mtmp->data->mflags1 & 0x10000) == 0) &&
           ((poVar10 = which_armor(mtmp,4), poVar10 == (obj *)0x0 ||
            (poVar10 = which_armor(mtmp,4), poVar10->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic != 0) {
LAB_001f4f4f:
            if (ublindf != (obj *)0x0) {
LAB_001f4f54:
              if (ublindf->oartifact == '\x1d') goto LAB_001f4ff4;
            }
            if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                 (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                 youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_001f4ff4;
LAB_001f51ea:
            pcVar9 = "killed";
            goto LAB_001f5076;
          }
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f4f54;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f4f4f;
LAB_001f4ff4:
          if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001f5046;
          iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          pcVar9 = "killed";
          if (iVar4 < 0x41) goto LAB_001f51ea;
          if (u.uprops[0x42].intrinsic != 0) goto LAB_001f5076;
        }
        else {
LAB_001f5046:
          if (u.uprops[0x42].intrinsic != 0) goto LAB_001f506f;
        }
        if (u.uprops[0x42].extrinsic == 0) {
          bVar3 = match_warn_of_mon(mtmp);
          pcVar9 = "killed";
          if (bVar3 == '\0') {
            pcVar9 = "destroyed";
          }
          goto LAB_001f5076;
        }
      }
      else {
        bVar3 = worm_known(level,mtmp);
        if (bVar3 == '\0') goto LAB_001f4efb;
LAB_001f4ea5:
        uVar6 = *(uint *)&mtmp->field_0x60;
        if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)
           ) {
          if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_001f4eee;
          goto LAB_001f4efb;
        }
        if ((uVar6 & 0x280) != 0) goto LAB_001f4efb;
LAB_001f4eee:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_001f4efb;
      }
LAB_001f506f:
      pcVar9 = "killed";
    }
LAB_001f5076:
    pline("%s is %s!",pcVar8,pcVar9);
  }
  if ((flags.mon_moving == '\0') &&
     (((-1 < range || (otmp->otyp != 0x214)) || ((otmp->field_0x4b & 0x80) != 0)))) {
    xkilled(mtmp,0);
  }
  else {
    mondied(mtmp);
  }
LAB_001f50be:
  uVar11 = 0xfe;
  if (otmp->otyp == 0x218) {
    uVar11 = '\n';
  }
  bVar3 = can_blnd((monst *)0x0,mtmp,uVar11,otmp);
  if (bVar3 != '\0') {
    uVar6 = *(uint *)&mtmp->field_0x60;
    if ((uVar6 >> 0x11 & 1) != 0 && bVar12 != 0) {
      pcVar8 = Monnam(mtmp);
      pcVar9 = xname(otmp);
      pcVar9 = the(pcVar9);
      pline("%s is blinded by %s.",pcVar8,pcVar9);
      uVar6 = *(uint *)&mtmp->field_0x60;
    }
    *(uint *)&mtmp->field_0x60 = uVar6 & 0xfffdffff;
    bVar12 = mtmp->mblinded;
    uVar6 = mt_random();
    uVar7 = uVar6 % 0x19 + (uint)bVar12 + 1;
    uVar6 = 0x6b;
    if (uVar7 < 0x6b) {
      uVar6 = uVar7;
    }
    mtmp->mblinded = (char)uVar6 + '\x14';
  }
  iVar4 = drop_throw(magr,otmp,ostack,'\x01','\x01',(int)bhitpos.x,(int)bhitpos.y);
  if (range == -1) {
    if (iVar4 == 0) {
      obj_extract_self(otmp);
      return 0;
    }
    return 1;
  }
  return 1;
}

Assistant:

int ohitmon(struct monst *magr,	/* thrower/firer, if any */
	    struct monst *mtmp,	/* accidental target */
	    struct obj *otmp,	/* missile; might be destroyed by drop_throw */
	    struct obj *ostack,	/* stack from which otmp came, if any */
	    int range,		/* how much farther will object travel if it misses */
				/* Use -1 to signify to keep going even after hit, */
				/* unless its gone (used for rolling_boulder_traps) */
	    boolean verbose)	/* give message(s) even when you can't see what happened */
{
	int damage, tmp;
	boolean vis, ismimic;
	int objgone = 1;

	ismimic = mtmp->m_ap_type && mtmp->m_ap_type != M_AP_MONSTER;
	vis = cansee(bhitpos.x, bhitpos.y);

	tmp = 5 + find_mac(mtmp) + omon_adj(mtmp, otmp, FALSE);
	if (tmp < rnd(20)) {
	    if (!ismimic) {
		if (vis) miss(distant_name(otmp, mshot_xname), mtmp);
		else if (verbose) pline("It is missed.");
	    }
	    if (!range) { /* Last position; object drops */
		drop_throw(magr, otmp, ostack, FALSE, FALSE,
			   mtmp->mx, mtmp->my);
		return 1;
	    }
	} else if (otmp->oclass == POTION_CLASS) {
	    if (ismimic) seemimic(mtmp);
	    mtmp->msleeping = 0;
	    if (vis) otmp->dknown = 1;
	    potionhit(mtmp, otmp, FALSE);
	    return 1;
	} else {
	    damage = dmgval(magr, otmp, TRUE, mtmp);
	    if (otmp->otyp == ACID_VENOM && resists_acid(mtmp))
		damage = 0;
	    if (ismimic) seemimic(mtmp);
	    mtmp->msleeping = 0;
	    if (vis) hit(distant_name(otmp,mshot_xname), FALSE, mtmp, exclam(damage));
	    else if (verbose) pline("%s is hit%s", Monnam(mtmp), exclam(damage));

	    if (touch_disintegrates(mtmp->data) && !mtmp->mcan && mtmp->mhp > 6 &&
		!oresist_disintegration(otmp)) {
		damage = otmp->owt;
		weight_dmg(damage);
		mtmp->mhp -= damage;
		if (vis) pline("It disintegrates!");
		obfree(otmp, NULL);
		return 1;
	    }

	    if (otmp->opoisoned && is_poisonable(otmp)) {
		if (resists_poison(mtmp)) {
		    if (vis) pline("The poison doesn't seem to affect %s.",
				   mon_nam(mtmp));
		} else {
		    if (rn2(30)) {
			damage += rnd(6);
		    } else {
			if (vis) pline("The poison was deadly...");
			damage = mtmp->mhp;
		    }
		}
	    }
	    if (objects[otmp->otyp].oc_material == SILVER &&
		    hates_silver(mtmp->data)) {
		if (vis) pline("The silver sears %s flesh!",
				s_suffix(mon_nam(mtmp)));
		else if (verbose) pline("Its flesh is seared!");
	    }
	    if (otmp->otyp == ACID_VENOM && cansee(mtmp->mx,mtmp->my)) {
		if (resists_acid(mtmp)) {
		    if (vis || verbose)
			pline("%s is unaffected.", Monnam(mtmp));
		    damage = 0;
		} else {
		    if (vis) pline("The acid burns %s!", mon_nam(mtmp));
		    else if (verbose) pline("It is burned!");
		}
	    }
	    mtmp->mhp -= damage;
	    if (mtmp->mhp < 1) {
		if (vis || verbose)
		    pline("%s is %s!", Monnam(mtmp),
			(nonliving(mtmp->data) || !canspotmon(level, mtmp))
			? "destroyed" : "killed");
		/* don't blame hero for unknown rolling boulder trap */
		if (!flags.mon_moving &&
		    (otmp->otyp != BOULDER || range >= 0 || otmp->otrapped))
		    xkilled(mtmp,0);
		else mondied(mtmp);
	    }

	    if (can_blnd(NULL, mtmp,
		    (uchar)(otmp->otyp == BLINDING_VENOM ? AT_SPIT : AT_WEAP),
		    otmp)) {
		if (vis && mtmp->mcansee)
		    pline("%s is blinded by %s.", Monnam(mtmp), the(xname(otmp)));
		mtmp->mcansee = 0;
		tmp = (int)mtmp->mblinded + rnd(25) + 20;
		if (tmp > 127) tmp = 127;
		mtmp->mblinded = tmp;
	    }

	    objgone = drop_throw(magr, otmp, ostack, TRUE, TRUE,
				 bhitpos.x, bhitpos.y);
	    if (!objgone && range == -1) {  /* special case */
		    obj_extract_self(otmp); /* free it for motion again */
		    return 0;
	    }
	    return 1;
	}
	return 0;
}